

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature(cmMakefile *this,cmTarget *target,string *feature)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  char **ppcVar6;
  bool bVar7;
  byte local_40b;
  byte local_40a;
  byte local_409;
  char **local_3f8;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  byte local_2c9;
  cmStrCmp local_2c8;
  byte local_2a1;
  cmStrCmp local_2a0;
  byte local_279;
  cmStrCmp local_278;
  byte local_254;
  byte local_253;
  byte local_252;
  byte local_251;
  undefined1 local_250 [4];
  bool setCxx14;
  bool setCxx11;
  bool setCxx98;
  char **local_230;
  char **existingCxxIt;
  ostringstream local_208 [8];
  ostringstream e;
  cmStrCmp local_90;
  allocator local_59;
  string local_58;
  char *local_38;
  char *existingCxxStandard;
  bool needCxx14;
  bool needCxx11;
  string *psStack_28;
  bool needCxx98;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  existingCxxStandard._7_1_ = 0;
  existingCxxStandard._6_1_ = 0;
  existingCxxStandard._5_1_ = 0;
  psStack_28 = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  CheckNeededCxxLanguage
            (this,feature,(bool *)((long)&existingCxxStandard + 7),
             (bool *)((long)&existingCxxStandard + 6),(bool *)((long)&existingCxxStandard + 5));
  psVar5 = feature_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CXX_STANDARD",&local_59);
  pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_90,local_38);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_90);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_90);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_208);
      poVar4 = std::operator<<((ostream *)local_208,"The CXX_STANDARD property on target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,local_38);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,(string *)&existingCxxIt);
      std::__cxx11::string::~string((string *)&existingCxxIt);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_208);
      goto LAB_004bf59e;
    }
  }
  local_251 = 0;
  if (local_38 == (char *)0x0) {
    local_3f8 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
  }
  else {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp((cmStrCmp *)local_250,local_38);
    local_251 = 1;
    local_3f8 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,(cmStrCmp *)local_250);
  }
  if ((local_251 & 1) != 0) {
    cmStrCmp::~cmStrCmp((cmStrCmp *)local_250);
  }
  local_230 = local_3f8;
  local_409 = 0;
  if ((existingCxxStandard._7_1_ & 1) != 0) {
    local_409 = local_38 != (char *)0x0 ^ 0xff;
  }
  local_252 = local_409 & 1;
  local_40a = 0;
  if ((existingCxxStandard._6_1_ & 1) != 0) {
    local_40a = local_38 != (char *)0x0 ^ 0xff;
  }
  local_253 = local_40a & 1;
  local_40b = 0;
  if ((existingCxxStandard._5_1_ & 1) != 0) {
    local_40b = local_38 != (char *)0x0 ^ 0xff;
  }
  local_254 = local_40b & 1;
  local_279 = 0;
  bVar7 = false;
  if (((existingCxxStandard._5_1_ & 1) != 0) && (bVar7 = false, local_38 != (char *)0x0)) {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_278,"14");
    local_279 = 1;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_278);
    bVar7 = local_3f8 < ppcVar2;
  }
  if ((local_279 & 1) != 0) {
    cmStrCmp::~cmStrCmp(&local_278);
  }
  ppcVar2 = local_230;
  if (bVar7) {
    local_254 = 1;
  }
  else {
    local_2a1 = 0;
    bVar7 = false;
    if (((existingCxxStandard._6_1_ & 1) != 0) && (bVar7 = false, local_38 != (char *)0x0)) {
      ppcVar3 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
      ppcVar6 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
      cmStrCmp::cmStrCmp(&local_2a0,"11");
      local_2a1 = 1;
      ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2a0);
      bVar7 = ppcVar2 < ppcVar3;
    }
    if ((local_2a1 & 1) != 0) {
      cmStrCmp::~cmStrCmp(&local_2a0);
    }
    ppcVar2 = local_230;
    if (bVar7) {
      local_253 = 1;
    }
    else {
      local_2c9 = 0;
      bVar7 = false;
      if (((existingCxxStandard._7_1_ & 1) != 0) && (bVar7 = false, local_38 != (char *)0x0)) {
        ppcVar3 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
        ppcVar6 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
        cmStrCmp::cmStrCmp(&local_2c8,"98");
        local_2c9 = 1;
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2c8);
        bVar7 = ppcVar2 < ppcVar3;
      }
      if ((local_2c9 & 1) != 0) {
        cmStrCmp::~cmStrCmp(&local_2c8);
      }
      if (bVar7) {
        local_252 = 1;
      }
    }
  }
  psVar5 = feature_local;
  if ((local_254 & 1) == 0) {
    if ((local_253 & 1) == 0) {
      if ((local_252 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_340,"CXX_STANDARD",&local_341);
        cmTarget::SetProperty((cmTarget *)psVar5,&local_340,"98");
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_318,"CXX_STANDARD",&local_319);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_318,"11");
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"CXX_STANDARD",&local_2f1);
    cmTarget::SetProperty((cmTarget *)psVar5,&local_2f0,"14");
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  }
  this_local._7_1_ = 1;
LAB_004bf59e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::
AddRequiredTargetCxxFeature(cmTarget *target,
                            const std::string& feature) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14);

  const char *existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard)
    {
    if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                  cmStrCmp(existingCxxStandard)) == cmArrayEnd(CXX_STANDARDS))
      {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  const char * const *existingCxxIt = existingCxxStandard
                                    ? std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp(existingCxxStandard))
                                    : cmArrayEnd(CXX_STANDARDS);

  bool setCxx98 = needCxx98 && !existingCxxStandard;
  bool setCxx11 = needCxx11 && !existingCxxStandard;
  bool setCxx14 = needCxx14 && !existingCxxStandard;

  if (needCxx14 && existingCxxStandard && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("14")))
    {
    setCxx14 = true;
    }
  else if (needCxx11 && existingCxxStandard && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("11")))
    {
    setCxx11 = true;
    }
  else if(needCxx98 && existingCxxStandard && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("98")))
    {
    setCxx98 = true;
    }

  if (setCxx14)
    {
    target->SetProperty("CXX_STANDARD", "14");
    }
  else if (setCxx11)
    {
    target->SetProperty("CXX_STANDARD", "11");
    }
  else if (setCxx98)
    {
    target->SetProperty("CXX_STANDARD", "98");
    }
  return true;
}